

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::DuplicateNameChecker::visit(DuplicateNameChecker *this,Function *f)

{
  Identifier IVar1;
  bool bVar2;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *this_00;
  reference this_01;
  Block *pBVar3;
  VariableDeclaration *pVVar4;
  pool_ref<soul::AST::Statement> local_98;
  pool_ptr<soul::AST::VariableDeclaration> local_90;
  pool_ptr<soul::AST::VariableDeclaration> v;
  pool_ref<soul::AST::Statement> *s;
  iterator __end3;
  iterator __begin3;
  vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
  *__range3;
  pool_ref<soul::AST::VariableDeclaration> *param;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range2;
  DuplicateNameChecker duplicateNameChecker;
  Function *f_local;
  DuplicateNameChecker *this_local;
  
  duplicateNameChecker.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)f;
  ASTVisitor::visit(&this->super_ASTVisitor,f);
  soul::DuplicateNameChecker::DuplicateNameChecker((DuplicateNameChecker *)&__range2);
  this_00 = (vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
             *)((long)&duplicateNameChecker.names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[2].field_2 + 8);
  __end2 = std::
           vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ::begin(this_00);
  param = (pool_ref<soul::AST::VariableDeclaration> *)
          std::
          vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
          ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                                     *)&param), bVar2) {
    this_01 = __gnu_cxx::
              __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
              ::operator*(&__end2);
    pVVar4 = pool_ref<soul::AST::VariableDeclaration>::operator->(this_01);
    IVar1.name = (pVVar4->name).name;
    pVVar4 = pool_ref<soul::AST::VariableDeclaration>::operator->(this_01);
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              ((DuplicateNameChecker *)&__range2,IVar1,
               &(pVVar4->super_Statement).super_ASTObject.context);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  bVar2 = pool_ptr<soul::AST::Block>::operator!=
                    ((pool_ptr<soul::AST::Block> *)
                     &duplicateNameChecker.names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[6].field_2.
                      _M_allocated_capacity,(void *)0x0);
  if (bVar2) {
    pBVar3 = pool_ptr<soul::AST::Block>::operator->
                       ((pool_ptr<soul::AST::Block> *)
                        &duplicateNameChecker.names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage[6].field_2.
                         _M_allocated_capacity);
    __end3 = std::
             vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
             ::begin(&pBVar3->statements);
    s = (pool_ref<soul::AST::Statement> *)
        std::
        vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
        ::end(&pBVar3->statements);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
                                       *)&s), bVar2) {
      v.object = (VariableDeclaration *)
                 __gnu_cxx::
                 __normal_iterator<soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
                 ::operator*(&__end3);
      local_98.object = (Statement *)((v.object)->super_Statement).super_ASTObject._vptr_ASTObject;
      cast<soul::AST::VariableDeclaration,soul::AST::Statement>((soul *)&local_90,&local_98);
      pool_ref<soul::AST::Statement>::~pool_ref(&local_98);
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_90);
      if (bVar2) {
        pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_90);
        IVar1.name = (pVVar4->name).name;
        pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_90);
        soul::DuplicateNameChecker::check<soul::AST::Context&>
                  ((DuplicateNameChecker *)&__range2,IVar1,
                   &(pVVar4->super_Statement).super_ASTObject.context);
      }
      pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr(&local_90);
      __gnu_cxx::
      __normal_iterator<soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
      ::operator++(&__end3);
    }
  }
  soul::DuplicateNameChecker::~DuplicateNameChecker((DuplicateNameChecker *)&__range2);
  return;
}

Assistant:

void visit (AST::Function& f) override
        {
            super::visit (f);
            soul::DuplicateNameChecker duplicateNameChecker;

            for (auto& param : f.parameters)
                duplicateNameChecker.check (param->name, param->context);

            if (f.block != nullptr)
            {
                // Ensure top level block variables do not duplicate parameter names
                for (auto& s : f.block->statements)
                    if (auto v = cast<AST::VariableDeclaration> (s))
                        duplicateNameChecker.check (v->name, v->context);
            }
        }